

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Print
          (Printer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables,char *text)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  const_iterator cVar6;
  int iVar7;
  int iVar8;
  char *__s;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_bool>
  pVar9;
  string varname;
  LogFinisher local_b1;
  key_type local_b0;
  char *local_90;
  size_t local_88;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
  *local_80;
  _Base_ptr local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  long *local_68 [2];
  long local_58 [2];
  size_t local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  sVar3 = strlen(text);
  local_80 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
              *)&this->substitutions_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
           *)local_80);
  local_88 = sVar3;
  if ((int)sVar3 < 1) {
    iVar7 = 0;
  }
  else {
    local_78 = &(variables->_M_t)._M_impl.super__Rb_tree_header._M_header;
    iVar7 = 0;
    iVar8 = 0;
    local_90 = text;
    local_70 = &variables->_M_t;
    do {
      if (text[iVar8] == '\n') {
        WriteRaw(this,text + iVar7,(iVar8 + 1) - iVar7);
        this->at_start_of_line_ = true;
        iVar7 = iVar8 + 1;
      }
      else if (text[iVar8] == this->variable_delimiter_) {
        WriteRaw(this,text + iVar7,iVar8 - iVar7);
        __s = text + (long)iVar8 + 1;
        pcVar4 = strchr(__s,(int)this->variable_delimiter_);
        if (pcVar4 == (char *)0x0) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                     ,0x88);
          pLVar5 = internal::LogMessage::operator<<
                             ((LogMessage *)local_68," Unclosed variable name.");
          internal::LogFinisher::operator=((LogFinisher *)&local_b0,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)local_68);
          pcVar4 = __s;
          text = local_90;
        }
        iVar7 = iVar8 + 1;
        iVar8 = (int)pcVar4 - (int)text;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,__s,__s + (iVar8 - iVar7));
        if (local_b0._M_string_length == 0) {
          WriteRaw(this,&this->variable_delimiter_,1);
        }
        else {
          cVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(local_70,&local_b0);
          if (cVar6._M_node == local_78) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/printer.cc"
                       ,0x95);
            pLVar5 = internal::LogMessage::operator<<
                               ((LogMessage *)local_68," Undefined variable: ");
            pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_b0);
            internal::LogFinisher::operator=(&local_b1,pLVar5);
            internal::LogMessage::~LogMessage((LogMessage *)local_68);
          }
          else {
            sVar1 = this->offset_;
            WriteRaw(this,*(char **)(cVar6._M_node + 2),*(int *)&cVar6._M_node[2]._M_parent);
            sVar2 = this->offset_;
            local_68[0] = local_58;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_68,local_b0._M_dataplus._M_p,
                       local_b0._M_dataplus._M_p + local_b0._M_string_length);
            local_48 = sVar1;
            local_40._M_allocated_capacity = sVar2;
            pVar9 = std::
                    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
                    ::
                    _M_emplace_unique<std::pair<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>>
                              (local_80,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
                                         *)local_68);
            text = local_90;
            if (local_68[0] != local_58) {
              operator_delete(local_68[0],local_58[0] + 1);
            }
            if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              *(undefined8 *)(pVar9.first._M_node._M_node + 2) = 1;
              pVar9.first._M_node._M_node[2]._M_parent = (_Base_ptr)0x0;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        iVar7 = iVar8 + 1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < (int)local_88);
  }
  WriteRaw(this,text + iVar7,(int)local_88 - iVar7);
  return;
}

Assistant:

void Printer::Print(const std::map<string, string>& variables,
                    const char* text) {
  int size = strlen(text);
  int pos = 0;  // The number of bytes we've written so far.
  substitutions_.clear();

  for (int i = 0; i < size; i++) {
    if (text[i] == '\n') {
      // Saw newline.  If there is more text, we may need to insert an indent
      // here.  So, write what we have so far, including the '\n'.
      WriteRaw(text + pos, i - pos + 1);
      pos = i + 1;

      // Setting this true will cause the next WriteRaw() to insert an indent
      // first.
      at_start_of_line_ = true;

    } else if (text[i] == variable_delimiter_) {
      // Saw the start of a variable name.

      // Write what we have so far.
      WriteRaw(text + pos, i - pos);
      pos = i + 1;

      // Find closing delimiter.
      const char* end = strchr(text + pos, variable_delimiter_);
      if (end == NULL) {
        GOOGLE_LOG(DFATAL) << " Unclosed variable name.";
        end = text + pos;
      }
      int endpos = end - text;

      string varname(text + pos, endpos - pos);
      if (varname.empty()) {
        // Two delimiters in a row reduce to a literal delimiter character.
        WriteRaw(&variable_delimiter_, 1);
      } else {
        // Replace with the variable's value.
        std::map<string, string>::const_iterator iter = variables.find(varname);
        if (iter == variables.end()) {
          GOOGLE_LOG(DFATAL) << " Undefined variable: " << varname;
        } else {
          size_t begin = offset_;
          WriteRaw(iter->second.data(), iter->second.size());
          std::pair<std::map<string, std::pair<size_t, size_t> >::iterator,
                    bool>
              inserted = substitutions_.insert(
                  std::make_pair(varname, std::make_pair(begin, offset_)));
          if (!inserted.second) {
            // This variable was used multiple times.  Make its span have
            // negative length so we can detect it if it gets used in an
            // annotation.
            inserted.first->second = std::make_pair(1, 0);
          }
        }
      }

      // Advance past this variable.
      i = endpos;
      pos = endpos + 1;
    }
  }

  // Write the rest.
  WriteRaw(text + pos, size - pos);
}